

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O0

void __thiscall
booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<char>_>::decrement
          (segment_index_iterator<std::_List_iterator<char>_> *this)

{
  pair<unsigned_long,_unsigned_long> pos;
  bool bVar1;
  unsigned_long in_RDI;
  unsigned_long unaff_retaddr;
  pair<unsigned_long,_unsigned_long> next;
  size_t in_stack_ffffffffffffffd8;
  segment_index_iterator<std::_List_iterator<char>_> *in_stack_ffffffffffffffe0;
  segment_index_iterator<std::_List_iterator<char>_> *local_18;
  segment_index_iterator<std::_List_iterator<char>_> *this_00;
  
  this_00 = *(segment_index_iterator<std::_List_iterator<char>_> **)(in_RDI + 0x20);
  local_18 = this_00;
  if ((*(byte *)(in_RDI + 0x34) & 1) == 0) {
    do {
      if (this_00 < (segment_index_iterator<std::_List_iterator<char>_> *)0x2) break;
      this_00 = (segment_index_iterator<std::_List_iterator<char>_> *)&this_00[-1].field_0x37;
      bVar1 = valid_offset(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    } while (!bVar1);
  }
  else {
    do {
      this_00 = local_18;
      if (local_18 < (segment_index_iterator<std::_List_iterator<char>_> *)0x2) break;
      local_18 = (segment_index_iterator<std::_List_iterator<char>_> *)&local_18[-1].field_0x37;
      bVar1 = valid_offset(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      this_00 = local_18;
    } while (!bVar1);
    do {
      if (local_18 == (segment_index_iterator<std::_List_iterator<char>_> *)0x0) break;
      local_18 = (segment_index_iterator<std::_List_iterator<char>_> *)&local_18[-1].field_0x37;
      bVar1 = valid_offset(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    } while (!bVar1);
  }
  pos.second = unaff_retaddr;
  pos.first = in_RDI;
  update_current(this_00,pos);
  return;
}

Assistant:

void decrement()
                    {
                        std::pair<size_t,size_t> next = current_;
                        if(full_select_) {
                            while(next.second >1) {
                                next.second--;
                                if(valid_offset(next.second))
                                    break;
                            }
                            next.first = next.second;
                            while(next.first >0) {
                                next.first--;
                                if(valid_offset(next.first))
                                    break;
                            }
                        }
                        else {
                            while(next.second >1) {
                                next.second--;
                                if(valid_offset(next.second))
                                    break;
                            }
                            next.first = next.second - 1;
                        }
                        update_current(next);
                    }